

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void Js::JavascriptOperators::PatchPutValueWithThisPtr<false,Js::PolymorphicInlineCache>
               (FunctionBody *functionBody,PolymorphicInlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,Var instance,PropertyId propertyId,Var newValue,
               Var thisInstance,PropertyOperationFlags flags)

{
  bool bVar1;
  ImplicitCallFlags currImplicitCallFlags_00;
  BOOL BVar2;
  ScriptContext *requestContext;
  ThreadContext *this;
  ImplicitCallFlags local_89;
  undefined1 local_88 [5];
  bool hasThisOnlyStatements;
  ImplicitCallFlags currImplicitCallFlags;
  ImplicitCallFlags prevImplicitCallFlags;
  PropertyValueInfo info;
  RecyclableObject *object;
  ScriptContext *scriptContext;
  Var newValue_local;
  PropertyId propertyId_local;
  Var instance_local;
  InlineCacheIndex inlineCacheIndex_local;
  PolymorphicInlineCache *inlineCache_local;
  FunctionBody *functionBody_local;
  
  requestContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  bVar1 = TaggedNumber::Is(instance);
  if (bVar1) {
    SetPropertyOnTaggedNumber
              (instance,(RecyclableObject *)0x0,propertyId,newValue,requestContext,flags);
  }
  else {
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(instance);
    info._56_8_ = VarTo<Js::RecyclableObject>(instance);
    PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)local_88);
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)local_88,functionBody,inlineCache,inlineCacheIndex,true);
    bVar1 = CacheOperators::TrySetProperty<true,true,true,true,true,false,true,false>
                      ((RecyclableObject *)info._56_8_,false,propertyId,newValue,requestContext,
                       flags,(PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)local_88);
    if (!bVar1) {
      bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,InlineCachePhase);
      if ((bVar1) && ((DAT_01ec73ca & 1) != 0)) {
        CacheOperators::TraceCache
                  (inlineCache,L"PatchPutValue",propertyId,requestContext,
                   (RecyclableObject *)info._56_8_);
      }
      local_89 = ImplicitCall_None;
      bVar1 = ParseableFunctionInfo::GetHasOnlyThisStmts(&functionBody->super_ParseableFunctionInfo)
      ;
      if (bVar1) {
        local_89 = CacheAndClearImplicitBit(requestContext);
      }
      BVar2 = OP_SetProperty((Var)info._56_8_,propertyId,newValue,requestContext,
                             (PropertyValueInfo *)local_88,flags,thisInstance);
      if (BVar2 == 0) {
        this = ScriptContext::GetThreadContext(requestContext);
        ThreadContext::AddImplicitCallFlags(this,ImplicitCall_NoOpSet);
      }
      if (bVar1) {
        currImplicitCallFlags_00 = CheckAndUpdateFunctionBodyWithImplicitFlag(functionBody);
        RestoreImplicitFlag(requestContext,local_89,currImplicitCallFlags_00);
      }
    }
  }
  return;
}

Assistant:

inline void JavascriptOperators::PatchPutValueWithThisPtr(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId, Var newValue, Var thisInstance, PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchPutValueWithThisPtr);
        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        if (TaggedNumber::Is(instance))
        {
            JavascriptOperators::SetPropertyOnTaggedNumber(instance, nullptr, propertyId, newValue, scriptContext, flags);
            return;
        }

#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
        RecyclableObject* object = VarTo<RecyclableObject>(instance);
        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        if (CacheOperators::TrySetProperty<true, true, true, true, true, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false>(
                object, false, propertyId, newValue, scriptContext, flags, nullptr, &info))
        {
            return;
        }

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(inlineCache, _u("PatchPutValue"), propertyId, scriptContext, object);
        }
#endif

        ImplicitCallFlags prevImplicitCallFlags = ImplicitCall_None;
        ImplicitCallFlags currImplicitCallFlags = ImplicitCall_None;
        bool hasThisOnlyStatements = functionBody->GetHasOnlyThisStmts();
        if (hasThisOnlyStatements)
        {
            prevImplicitCallFlags = CacheAndClearImplicitBit(scriptContext);
        }
        if (!JavascriptOperators::OP_SetProperty(object, propertyId, newValue, scriptContext, &info, flags, thisInstance))
        {
            // Add implicit call flags, to bail out if field copy prop may propagate the wrong value.
            scriptContext->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_NoOpSet);
        }
        if (hasThisOnlyStatements)
        {
            currImplicitCallFlags = CheckAndUpdateFunctionBodyWithImplicitFlag(functionBody);
            RestoreImplicitFlag(scriptContext, prevImplicitCallFlags, currImplicitCallFlags);
        }
        JIT_HELPER_END(Op_PatchPutValueWithThisPtr);
    }